

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginMainMenuBar(void)

{
  ImGuiViewportP *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImGuiWindow *pIVar5;
  float fVar6;
  ImVec2 menu_bar_pos;
  ImVec2 menu_bar_size;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  
  pIVar2 = GImGui;
  if (0 < (GImGui->Viewports).Size) {
    pIVar1 = *(GImGui->Viewports).Data;
    pIVar5 = FindWindowByName("##MainMenuBar");
    fVar6 = (pIVar2->Style).DisplaySafeAreaPadding.y - (pIVar2->Style).FramePadding.y;
    (pIVar2->NextWindowData).MenuBarOffsetMinVal.x = (pIVar2->Style).DisplaySafeAreaPadding.x;
    (pIVar2->NextWindowData).MenuBarOffsetMinVal.y = (float)(-(uint)(0.0 <= fVar6) & (uint)fVar6);
    if ((pIVar5 == (ImGuiWindow *)0x0) || (pIVar5->BeginCount == 0)) {
      fVar6 = (pIVar1->CurrWorkOffsetMin).x;
      local_38.y = (pIVar1->super_ImGuiViewport).Pos.y + (pIVar1->CurrWorkOffsetMin).y;
      local_38.x = (pIVar1->super_ImGuiViewport).Pos.x + fVar6;
      local_28.x = ((pIVar1->super_ImGuiViewport).Size.x - fVar6) + (pIVar1->CurrWorkOffsetMax).x;
      local_28.y = 1.0;
      local_30.x = 0.0;
      local_30.y = 0.0;
      SetNextWindowPos(&local_38,0,&local_30);
      SetNextWindowSize(&local_28,0);
    }
    SetNextWindowViewport((pIVar1->super_ImGuiViewport).ID);
    PushStyleVar(2,0.0);
    local_38.x = 0.0;
    local_38.y = 0.0;
    PushStyleVar(4,&local_38);
    bVar4 = false;
    bVar3 = Begin("##MainMenuBar",(bool *)0x0,0x20050f);
    if (bVar3) {
      bVar4 = BeginMenuBar();
    }
    PopStyleVar(2);
    pIVar5 = GImGui->CurrentWindow;
    pIVar5->WriteAccessed = true;
    if (pIVar5->BeginCount == 1) {
      (pIVar1->CurrWorkOffsetMin).y = (pIVar5->Size).y + (pIVar1->CurrWorkOffsetMin).y;
    }
    (pIVar2->NextWindowData).MenuBarOffsetMinVal.x = 0.0;
    (pIVar2->NextWindowData).MenuBarOffsetMinVal.y = 0.0;
    if (bVar4 == false) {
      End();
    }
    return bVar4;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                ,0x5c2,"T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]");
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = g.Viewports[0];
    ImGuiWindow* menu_bar_window = FindWindowByName("##MainMenuBar");

    // For the main menu bar, which cannot be moved, we honor g.Style.DisplaySafeAreaPadding to ensure text can be visible on a TV set.
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));

    // Get our rectangle at the top of the work area
    if (menu_bar_window == NULL || menu_bar_window->BeginCount == 0)
    {
        // Set window position
        // We don't attempt to calculate our height ahead, as it depends on the per-viewport font size. However menu-bar will affect the minimum window size so we'll get the right height.
        ImVec2 menu_bar_pos = viewport->Pos + viewport->CurrWorkOffsetMin;
        ImVec2 menu_bar_size = ImVec2(viewport->Size.x - viewport->CurrWorkOffsetMin.x + viewport->CurrWorkOffsetMax.x, 1.0f);
        SetNextWindowPos(menu_bar_pos);
        SetNextWindowSize(menu_bar_size);
    }

    // Create window
    SetNextWindowViewport(viewport->ID); // Enforce viewport so we don't create our own viewport when ImGuiConfigFlags_ViewportsNoMerge is set.
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0));    // Lift normal size constraint, however the presence of a menu-bar will give us the minimum height we want.
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoDocking | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);

    // Report our size into work area (for next frame) using actual window size
    menu_bar_window = GetCurrentWindow();
    if (menu_bar_window->BeginCount == 1)
        viewport->CurrWorkOffsetMin.y += menu_bar_window->Size.y;

    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true; //-V1020
}